

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O2

bool binlog::operator==(EventSource *a,EventSource *b)

{
  __type _Var1;
  
  if ((a->id == b->id) && (a->severity == b->severity)) {
    _Var1 = std::operator==(&a->category,&b->category);
    if (_Var1) {
      _Var1 = std::operator==(&a->function,&b->function);
      if (_Var1) {
        _Var1 = std::operator==(&a->file,&b->file);
        if ((_Var1) && (a->line == b->line)) {
          _Var1 = std::operator==(&a->formatString,&b->formatString);
          if (_Var1) {
            _Var1 = std::operator==(&a->argumentTags,&b->argumentTags);
            return _Var1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const EventSource& a, const EventSource& b)
{
  return a.id == b.id
    &&   a.severity == b.severity
    &&   a.category == b.category
    &&   a.function == b.function
    &&   a.file == b.file
    &&   a.line == b.line
    &&   a.formatString == b.formatString
    &&   a.argumentTags == b.argumentTags;
}